

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::WrapperFieldGenerator
          (WrapperFieldGenerator *this,FieldDescriptor *descriptor,int fieldOrdinal,Options *options
          )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  FieldDescriptor *this_01;
  Type TVar1;
  mapped_type *pmVar2;
  Descriptor *pDVar3;
  allocator<char> local_81;
  string local_80;
  key_type local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  FieldGeneratorBase::FieldGeneratorBase
            (&this->super_FieldGeneratorBase,descriptor,fieldOrdinal,options);
  (this->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__WrapperOneofFieldGenerator_00426340;
  FieldGeneratorBase::name_abi_cxx11_(&local_80,&this->super_FieldGeneratorBase);
  std::operator+(&local_40,&local_80,"_ != null");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"has_property_check",&local_81);
  this_00 = &(this->super_FieldGeneratorBase).variables_;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_60);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  FieldGeneratorBase::name_abi_cxx11_(&local_80,&this->super_FieldGeneratorBase);
  std::operator+(&local_40,&local_80,"_ == null");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"has_not_property_check",&local_81);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_60);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  pDVar3 = FieldDescriptor::message_type(descriptor);
  this_01 = *(FieldDescriptor **)(pDVar3 + 0x30);
  TVar1 = FieldDescriptor::type(this_01);
  if (TVar1 == TYPE_STRING) {
    this->is_value_type = false;
  }
  else {
    TVar1 = FieldDescriptor::type(this_01);
    this->is_value_type = TVar1 != TYPE_BYTES;
    if (TVar1 != TYPE_BYTES) {
      FieldGeneratorBase::type_name_abi_cxx11_(&local_40,&this->super_FieldGeneratorBase,this_01);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"nonnullable_type_name",(allocator<char> *)&local_60);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](this_00,&local_80);
      std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_40);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return;
}

Assistant:

WrapperFieldGenerator::WrapperFieldGenerator(const FieldDescriptor* descriptor,
                                       int fieldOrdinal, const Options *options)
    : FieldGeneratorBase(descriptor, fieldOrdinal, options) {
  variables_["has_property_check"] = name() + "_ != null";
  variables_["has_not_property_check"] = name() + "_ == null";
  const FieldDescriptor* wrapped_field = descriptor->message_type()->field(0);
  is_value_type = wrapped_field->type() != FieldDescriptor::TYPE_STRING &&
      wrapped_field->type() != FieldDescriptor::TYPE_BYTES;
  if (is_value_type) {
    variables_["nonnullable_type_name"] = type_name(wrapped_field);
  }
}